

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ComputeShaderGeneratedCase::
genComputeSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool computeCmd,bool computeData,
          bool computeIndices)

{
  ostream *poVar1;
  string *psVar2;
  undefined7 in_register_00000009;
  int iVar3;
  undefined7 in_register_00000011;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  ostringstream buf;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = (int)CONCAT71(in_register_00000011,computeCmd);
  uVar6 = 2;
  if ((int)CONCAT71(in_register_00000009,computeData) == 0) {
    uVar6 = (uint)(computeCmd || computeData);
  }
  if (iVar3 == 0) {
    uVar6 = (uint)(computeCmd || computeData);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 310 es\n\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp int;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n\n",0x18);
  if (*(int *)((long)this + 0x78) == 0 && computeCmd) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"struct DrawArraysIndirectCommand {\n",0x23);
    lVar4 = 0x10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    uint count;\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    uint primCount;\n",0x14);
    pcVar5 = "    uint first;\n";
LAB_0038b848:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    uint reservedMustBeZero;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n\n",4);
  }
  else if (*(int *)((long)this + 0x78) == 1 && computeCmd) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"struct DrawElementsIndirectCommand {\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    uint count;\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    uint primCount;\n",0x14);
    lVar4 = 0x15;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    uint firstIndex;\n",0x15);
    pcVar5 = "    int  baseVertex;\n";
    goto LAB_0038b848;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(local_size_x = 1, local_size_y = 1) in;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(std430) buffer;\n\n",0x18);
  if (computeCmd) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(binding = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,") writeonly buffer CommandBuffer {\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    ",4);
    bVar7 = *(int *)((long)this + 0x78) != 0;
    pcVar5 = "DrawElementsIndirectCommand";
    if (!bVar7) {
      pcVar5 = "DrawArraysIndirectCommand";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,(ulong)bVar7 * 2 + 0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," commands[];\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"};\n",3);
  }
  if (computeData) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(binding = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,") writeonly buffer DataBuffer {\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    vec4 attribs[];\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"};\n",3);
  }
  if (computeIndices) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(binding = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,uVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,") writeonly buffer IndexBuffer {\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uint indices[];\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"};\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main() {\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    const uint gridSize      = ",0x1f);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,*(int *)((long)this + 0x88));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"u;\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    const uint triangleCount = gridSize * gridSize * 2u;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (computeCmd) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    // command\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    if (gl_GlobalInvocationID.x < ",0x22);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,*(int *)((long)this + 0x84));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"u && gl_GlobalInvocationID.y == 0u && gl_GlobalInvocationID.z == 0u) {\n",
               0x47);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"        const uint numDrawCallTris = triangleCount / ",0x35);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x84));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"u;\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "        uint firstTri              = gl_GlobalInvocationID.x * numDrawCallTris;\n\n"
               ,0x51);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "        commands[gl_GlobalInvocationID.x].count                 = numDrawCallTris*3u;\n"
               ,0x56);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"        commands[gl_GlobalInvocationID.x].primCount             = 1u;\n",0x46
              );
    if (*(int *)((long)this + 0x78) == 0) {
      lVar4 = 0x4f;
      pcVar5 = "        commands[gl_GlobalInvocationID.x].first                 = firstTri*3u;\n";
LAB_0038bbc7:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
    }
    else if (*(int *)((long)this + 0x78) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "        commands[gl_GlobalInvocationID.x].firstIndex            = firstTri*3u;\n",
                 0x4f);
      lVar4 = 0x45;
      pcVar5 = "        commands[gl_GlobalInvocationID.x].baseVertex            = 0;\n";
      goto LAB_0038bbc7;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        commands[gl_GlobalInvocationID.x].reservedMustBeZero    = 0u;\n",0x46);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    }\n",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  if (!computeData) goto LAB_0038bf47;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    // vertex attribs\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    const vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    const vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n",0x31);
  if (*(int *)((long)this + 0x78) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "    if (gl_GlobalInvocationID.x < gridSize+1u && gl_GlobalInvocationID.y < gridSize+1u && gl_GlobalInvocationID.z == 0u) {\n"
               ,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        uint        y           = gl_GlobalInvocationID.x;\n",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        uint        x           = gl_GlobalInvocationID.y;\n",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n",0x4c)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n",0x4c)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[(y * (gridSize+1u) + x) * 4u + 0u] = vec4(posX, posY, 0.0, 1.0);\n",
               0x51);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        attribs[(y * (gridSize+1u) + x) * 4u + 1u] = green;\n",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[(y * (gridSize+1u) + x) * 4u + 2u] = vec4(posX, posY, 0.0, 1.0);\n",
               0x51);
    lVar4 = 0x3d;
    pcVar5 = "        attribs[(y * (gridSize+1u) + x) * 4u + 3u] = yellow;\n";
LAB_0038bf0e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    }\n",6);
  }
  else if (*(int *)((long)this + 0x78) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
               ,0x75);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        uint        y           = gl_GlobalInvocationID.x;\n",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        uint        x           = gl_GlobalInvocationID.y;\n",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n",0x4c)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n",0x4c)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        const float cellSize    = 2.0 / float(gridSize);\n",
               0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        vec4        color       = ((x + y)%2u != 0u) ? (yellow) : (green);\n",0x4b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 0u] = vec4(posX + cellSize, posY,            0.0, 1.0);\n"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 0u] = vec4(posX,            posY + cellSize, 0.0, 1.0);\n"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 1u] = color;\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 1u] = color;\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 1u] = color;\n",0x43);
    lVar4 = 0x43;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 1u] = color;\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 1u] = color;\n",0x43);
    pcVar5 = "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 1u] = color;\n";
    goto LAB_0038bf0e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
LAB_0038bf47:
  if (computeIndices) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    // indices\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
               ,0x75);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        uint    y       = gl_GlobalInvocationID.x;\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        uint    x       = gl_GlobalInvocationID.y;\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        uint    color   = ((x + y)%2u);\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        indices[(y * gridSize + x) * 6u + 0u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        indices[(y * gridSize + x) * 6u + 1u] = ((y+1u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        indices[(y * gridSize + x) * 6u + 2u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        indices[(y * gridSize + x) * 6u + 3u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        indices[(y * gridSize + x) * 6u + 4u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "        indices[(y * gridSize + x) * 6u + 5u] = ((y+0u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    }\n",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string ComputeShaderGeneratedCase::genComputeSource (bool computeCmd, bool computeData, bool computeIndices) const
{
	const int cmdLayoutBinding				= 0;
	const int dataLayoutBinding				= (computeCmd) ? (1) : (0);
	const int indexLayoutBinding			= (computeCmd && computeData) ? (2) : (computeCmd || computeData) ? (1) : (0);

	std::ostringstream buf;

	buf << "#version 310 es\n\n"
		<< "precision highp int;\n"
		<< "precision highp float;\n\n";

	if (computeCmd && m_drawMethod==DRAWMETHOD_DRAWARRAYS)
		buf	<< "struct DrawArraysIndirectCommand {\n"
			<< "    uint count;\n"
			<< "    uint primCount;\n"
			<< "    uint first;\n"
			<< "    uint reservedMustBeZero;\n"
			<< "};\n\n";
	else if (computeCmd && m_drawMethod==DRAWMETHOD_DRAWELEMENTS)
		buf	<< "struct DrawElementsIndirectCommand {\n"
			<< "    uint count;\n"
			<< "    uint primCount;\n"
			<< "    uint firstIndex;\n"
			<< "    int  baseVertex;\n"
			<< "    uint reservedMustBeZero;\n"
			<< "};\n\n";

	buf << "layout(local_size_x = 1, local_size_y = 1) in;\n"
		<< "layout(std430) buffer;\n\n";

	if (computeCmd)
		buf	<< "layout(binding = " << cmdLayoutBinding << ") writeonly buffer CommandBuffer {\n"
			<< "    " << ((m_drawMethod==DRAWMETHOD_DRAWARRAYS) ? ("DrawArraysIndirectCommand") : ("DrawElementsIndirectCommand")) << " commands[];\n"
			<< "};\n";
	if (computeData)
		buf	<< "layout(binding = " << dataLayoutBinding << ") writeonly buffer DataBuffer {\n"
			<< "    vec4 attribs[];\n"
			<< "};\n";
	if (computeIndices)
		buf	<< "layout(binding = " << indexLayoutBinding << ") writeonly buffer IndexBuffer {\n"
			<< "    uint indices[];\n"
			<< "};\n";

	buf	<< "\n"
		<< "void main() {\n"
		<< "    const uint gridSize      = " << m_gridSize << "u;\n"
		<< "    const uint triangleCount = gridSize * gridSize * 2u;\n"
		<< "\n";

	if (computeCmd)
	{
		buf	<< "    // command\n"
			<< "    if (gl_GlobalInvocationID.x < " << m_numDrawCmds << "u && gl_GlobalInvocationID.y == 0u && gl_GlobalInvocationID.z == 0u) {\n"
			<< "        const uint numDrawCallTris = triangleCount / " << m_numDrawCmds << "u;\n"
			<< "        uint firstTri              = gl_GlobalInvocationID.x * numDrawCallTris;\n\n"
			<< "        commands[gl_GlobalInvocationID.x].count                 = numDrawCallTris*3u;\n"
			<< "        commands[gl_GlobalInvocationID.x].primCount             = 1u;\n";

		if (m_drawMethod==DRAWMETHOD_DRAWARRAYS)
		{
			buf	<< "        commands[gl_GlobalInvocationID.x].first                 = firstTri*3u;\n";
		}
		else if (m_drawMethod==DRAWMETHOD_DRAWELEMENTS)
		{
			buf	<< "        commands[gl_GlobalInvocationID.x].firstIndex            = firstTri*3u;\n";
			buf	<< "        commands[gl_GlobalInvocationID.x].baseVertex            = 0;\n";
		}

		buf	<< "        commands[gl_GlobalInvocationID.x].reservedMustBeZero    = 0u;\n"
			<< "    }\n"
			<< "\n";
	}

	if (computeData)
	{
		buf	<< "    // vertex attribs\n"
			<< "    const vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
			<< "    const vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n";

		if (m_drawMethod == DRAWMETHOD_DRAWARRAYS)
		{
			buf	<< "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
				<< "        uint        y           = gl_GlobalInvocationID.x;\n"
				<< "        uint        x           = gl_GlobalInvocationID.y;\n"
				<< "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "        const float cellSize    = 2.0 / float(gridSize);\n"
				<< "        vec4        color       = ((x + y)%2u != 0u) ? (yellow) : (green);\n"
				<< "\n"
				<< "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 0u] = vec4(posX + cellSize, posY,            0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 0u] = vec4(posX,            posY + cellSize, 0.0, 1.0);\n"
				<< "\n"
				<< "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 1u] = color;\n"
				<< "    }\n";
		}
		else if (m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		{
			buf	<< "    if (gl_GlobalInvocationID.x < gridSize+1u && gl_GlobalInvocationID.y < gridSize+1u && gl_GlobalInvocationID.z == 0u) {\n"
				<< "        uint        y           = gl_GlobalInvocationID.x;\n"
				<< "        uint        x           = gl_GlobalInvocationID.y;\n"
				<< "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 0u] = vec4(posX, posY, 0.0, 1.0);\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 1u] = green;\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 2u] = vec4(posX, posY, 0.0, 1.0);\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 3u] = yellow;\n"
				<< "    }\n";
		}

		buf << "\n";
	}

	if (computeIndices)
	{
		buf	<< "    // indices\n"
			<< "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
			<< "        uint    y       = gl_GlobalInvocationID.x;\n"
			<< "        uint    x       = gl_GlobalInvocationID.y;\n"
			<< "        uint    color   = ((x + y)%2u);\n"
			<< "\n"
			<< "        indices[(y * gridSize + x) * 6u + 0u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 1u] = ((y+1u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 2u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 3u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 4u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 5u] = ((y+0u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
			<< "    }\n"
			<< "\n";
	}

	buf	<< "}\n";

	return buf.str();
}